

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O1

void do_opt(int *ip)

{
  byte bVar1;
  ushort *puVar2;
  uint uVar3;
  int iVar4;
  ushort **ppuVar5;
  ulong uVar6;
  byte *pbVar7;
  long lVar8;
  char *stptr;
  char name [32];
  undefined8 uStack_60;
  byte local_58 [40];
  
  uStack_60 = 0x10b491;
  ppuVar5 = __ctype_b_loc();
  puVar2 = *ppuVar5;
LAB_0010b4a5:
  do {
    uVar6 = (ulong)*ip;
    pbVar7 = (byte *)(prlnbuf + uVar6);
    bVar1 = prlnbuf[uVar6];
    while ((*(byte *)((long)puVar2 + (long)(char)bVar1 * 2 + 1) & 0x20) != 0) {
      uVar3 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar3;
      *ip = uVar3;
      bVar1 = pbVar7[1];
      pbVar7 = pbVar7 + 1;
    }
    *ip = (int)uVar6 + 1;
    bVar1 = *pbVar7;
  } while (bVar1 == 0x2c);
  if ((bVar1 == 0) || (bVar1 == 0x3b)) {
    if (pass != 1) {
      return;
    }
    println();
    return;
  }
  lVar8 = 0;
  do {
    if (bVar1 < 0x2c) {
      if (bVar1 == 0) break;
      if (bVar1 == 0x20) {
        do {
        } while( true );
      }
    }
    else if ((bVar1 == 0x2c) || (bVar1 == 0x3b)) break;
    if (lVar8 == 0x20) {
      stptr = "Syntax error!";
      goto LAB_0010b5c5;
    }
    local_58[lVar8] = bVar1;
    lVar8 = lVar8 + 1;
    iVar4 = *ip;
    *ip = iVar4 + 1;
    bVar1 = prlnbuf[iVar4];
  } while( true );
  bVar1 = local_58[lVar8 + -1];
  (local_58 + lVar8 + -1)[0] = 0;
  (local_58 + lVar8 + -1)[1] = 0;
  uStack_60 = 0x10b53d;
  iVar4 = strcasecmp((char *)local_58,"l");
  if (iVar4 == 0) {
    lVar8 = 0;
  }
  else {
    uStack_60 = 0x10b550;
    iVar4 = strcasecmp((char *)local_58,"m");
    if (iVar4 == 0) {
      lVar8 = 1;
    }
    else {
      uStack_60 = 0x10b563;
      iVar4 = strcasecmp((char *)local_58,"w");
      if (iVar4 == 0) {
        lVar8 = 2;
      }
      else {
        uStack_60 = 0x10b576;
        iVar4 = strcasecmp((char *)local_58,"o");
        lVar8 = 3;
        if (iVar4 != 0) {
          stptr = "Unknown option!";
LAB_0010b5c5:
          error(stptr);
          return;
        }
      }
    }
  }
  if (bVar1 == 0x2b) {
    iVar4 = 1;
  }
  else {
    if (bVar1 != 0x2d) goto LAB_0010b4a5;
    iVar4 = 0;
  }
  asm_opt[lVar8] = iVar4;
  goto LAB_0010b4a5;
}

Assistant:

void
do_opt(int *ip)
{
	char c;
	char flag;
	char name[32];
	int  opt;
	int  i;

	for (;;) {
		/* skip spaces */
		while (isspace(prlnbuf[*ip]))
			(*ip)++;

		/* get char */
		c = prlnbuf[(*ip)++];

		/* no option */
		if (c == ',')
			continue;

		/* end of line */
		if (c == ';' || c == '\0')
			break;

		/* extract option */
		i = 0;
		for (;;) {
			if (c == ' ')
				continue;
			if (c == ',' || c == ';' || c == '\0')
				break;
			if (i > 31) {
				error("Syntax error!");
				return;
			}
			name[i++] = c;
			c = prlnbuf[(*ip)++];
		}

		/* get option flag */
		name[i] = '\0';
		flag = name[--i];
		name[i] = '\0';

		/* search option */
		if (!strcasecmp(name, "l"))
			opt = OPT_LIST;
		else if (!strcasecmp(name, "m"))
			opt = OPT_MACRO;
		else if (!strcasecmp(name, "w"))
			opt = OPT_WARNING;
		else if (!strcasecmp(name, "o"))
			opt = OPT_OPTIMIZE;
		else {
			error("Unknown option!");
			return;
		}

		/* set option */
		if (flag == '+')
			asm_opt[opt] = 1;
		if (flag == '-')
			asm_opt[opt] = 0;
	}

	/* output */
	if (pass == LAST_PASS)
		println();
}